

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void ** CP_consolidateDataToAll
                  (SstStream Stream,void *LocalInfo,FFSTypeHandle Type,void **RetDataBlock)

{
  int iVar1;
  FFSContext p_Var2;
  size_t sVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  void *sendbuf;
  size_t *recvcounts;
  size_t *displs;
  void *recvbuf;
  void **ppvVar7;
  long lVar8;
  long lVar9;
  void **ppvVar10;
  size_t DataSize;
  
  uVar5 = create_FFSBuffer();
  uVar6 = FMFormat_of_original(Type);
  sendbuf = (void *)FFSencode(uVar5,uVar6,LocalInfo,&DataSize);
  recvcounts = (size_t *)malloc((long)Stream->CohortSize << 3);
  SMPI_Allgather(&DataSize,1,SMPI_SIZE_T,recvcounts,1,SMPI_SIZE_T,Stream->mpiComm);
  lVar9 = (long)Stream->CohortSize;
  displs = (size_t *)malloc(lVar9 * 8);
  *displs = 0;
  uVar4 = (int)*recvcounts + 7U & 0xfffffff8;
  if (1 < lVar9) {
    lVar8 = 1;
    do {
      sVar3 = recvcounts[lVar8];
      displs[lVar8] = (long)(int)uVar4;
      uVar4 = uVar4 + ((int)sVar3 + 7U & 0xfffffff8);
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  recvbuf = malloc((long)(int)uVar4);
  SMPI_Allgatherv(sendbuf,(int)DataSize,SMPI_CHAR,recvbuf,recvcounts,displs,SMPI_CHAR,
                  Stream->mpiComm);
  free_FFSBuffer(uVar5);
  p_Var2 = Stream->CPInfo->ffs_c;
  iVar1 = Stream->CohortSize;
  ppvVar7 = (void **)malloc((long)iVar1 * 8);
  if (0 < (long)iVar1) {
    lVar9 = 0;
    ppvVar10 = ppvVar7;
    do {
      FFSdecode_in_place(p_Var2,displs[lVar9] + (long)recvbuf,ppvVar10);
      lVar9 = lVar9 + 1;
      ppvVar10 = ppvVar10 + 1;
    } while (lVar9 < Stream->CohortSize);
  }
  free(displs);
  free(recvcounts);
  *RetDataBlock = recvbuf;
  return ppvVar7;
}

Assistant:

void **CP_consolidateDataToAll(SstStream Stream, void *LocalInfo, FFSTypeHandle Type,
                               void **RetDataBlock)
{
    FFSBuffer Buf = create_FFSBuffer();
    size_t DataSize;
    size_t *RecvCounts;
    char *Buffer;

    struct _CP_DP_init_info **Pointers = NULL;

    Buffer = FFSencode(Buf, FMFormat_of_original(Type), LocalInfo, &DataSize);

    RecvCounts = malloc(Stream->CohortSize * sizeof(*RecvCounts));

    SMPI_Allgather(&DataSize, 1, SMPI_SIZE_T, RecvCounts, 1, SMPI_SIZE_T, Stream->mpiComm);

    /*
     * Figure out the total length of block
     * and displacements for each rank
     */

    size_t *Displs;
    char *RecvBuffer = NULL;
    int i;

    int TotalLen = 0;
    Displs = malloc(Stream->CohortSize * sizeof(*Displs));

    Displs[0] = 0;
    TotalLen = (RecvCounts[0] + 7) & ~7;

    for (i = 1; i < Stream->CohortSize; i++)
    {
        int round_up = (RecvCounts[i] + 7) & ~7;
        Displs[i] = TotalLen;
        TotalLen += round_up;
    }

    RecvBuffer = malloc(TotalLen * sizeof(char));

    /*
     * Now we have the receive Buffer, counts, and displacements, and
     * can gather the data
     */

    SMPI_Allgatherv(Buffer, (int)DataSize, SMPI_CHAR, RecvBuffer, RecvCounts, Displs, SMPI_CHAR,
                    Stream->mpiComm);
    free_FFSBuffer(Buf);

    FFSContext context = Stream->CPInfo->ffs_c;

    Pointers = malloc(Stream->CohortSize * sizeof(Pointers[0]));
    for (i = 0; i < Stream->CohortSize; i++)
    {
        FFSdecode_in_place(context, RecvBuffer + Displs[i], (void **)&Pointers[i]);
    }
    free(Displs);
    free(RecvCounts);

    *RetDataBlock = RecvBuffer;
    return (void **)Pointers;
}